

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpivotgrowth.c
# Opt level: O3

double zPivotGrowth(int ncols,SuperMatrix *A,int *perm_c,SuperMatrix *L,SuperMatrix *U)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  void *addr;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  doublecomplex *pdVar16;
  double dVar17;
  double local_b8;
  double local_a8;
  long local_90;
  double local_78;
  
  local_b8 = dmach("S");
  pvVar4 = A->Store;
  pvVar5 = L->Store;
  pvVar6 = U->Store;
  lVar7 = *(long *)((long)pvVar4 + 8);
  lVar8 = *(long *)((long)pvVar5 + 8);
  lVar9 = *(long *)((long)pvVar6 + 8);
  addr = superlu_malloc((long)A->ncol << 2);
  if (0 < A->ncol) {
    lVar11 = 0;
    do {
      *(int *)((long)addr + (long)perm_c[lVar11] * 4) = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar11 < A->ncol);
  }
  local_b8 = 1.0 / local_b8;
  local_90 = 0;
  do {
    if (*(int *)((long)pvVar5 + 4) < local_90) break;
    iVar1 = *(int *)(*(long *)((long)pvVar5 + 0x30) + local_90 * 4);
    bVar10 = iVar1 < ncols;
    if ((iVar1 < ncols) && (iVar1 < *(int *)(*(long *)((long)pvVar5 + 0x30) + 4 + local_90 * 4))) {
      lVar11 = (long)iVar1;
      lVar13 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar11 * 4) * 0x10 + lVar8;
      iVar1 = *(int *)(*(long *)((long)pvVar5 + 0x20) + 4 + lVar11 * 4);
      iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar11 * 4);
      lVar15 = 0x10;
      do {
        lVar14 = (long)*(int *)((long)addr + lVar11 * 4);
        iVar3 = *(int *)(*(long *)((long)pvVar4 + 0x18) + lVar14 * 4);
        lVar12 = (long)iVar3;
        local_a8 = 0.0;
        local_78 = 0.0;
        if (iVar3 < *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar14 * 4)) {
          pdVar16 = (doublecomplex *)(lVar12 * 0x10 + lVar7);
          local_78 = 0.0;
          do {
            dVar17 = z_abs1(pdVar16);
            if (local_78 <= dVar17) {
              local_78 = z_abs1(pdVar16);
            }
            lVar12 = lVar12 + 1;
            pdVar16 = pdVar16 + 1;
          } while (lVar12 < *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar14 * 4));
        }
        iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar11 * 4);
        lVar14 = (long)iVar3;
        lVar12 = lVar11 + 1;
        if (iVar3 < *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar11 * 4)) {
          pdVar16 = (doublecomplex *)(lVar14 * 0x10 + lVar9);
          local_a8 = 0.0;
          do {
            dVar17 = z_abs1(pdVar16);
            if (local_a8 <= dVar17) {
              local_a8 = z_abs1(pdVar16);
            }
            lVar14 = lVar14 + 1;
            pdVar16 = pdVar16 + 1;
          } while (lVar14 < *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar12 * 4));
        }
        lVar11 = 0;
        do {
          dVar17 = z_abs1((doublecomplex *)(lVar13 + lVar11));
          if (local_a8 <= dVar17) {
            local_a8 = z_abs1((doublecomplex *)(lVar13 + lVar11));
          }
          lVar11 = lVar11 + 0x10;
        } while (lVar15 != lVar11);
        dVar17 = (double)(-(ulong)(local_a8 == 0.0) & 0x3ff0000000000000 |
                         ~-(ulong)(local_a8 == 0.0) & (ulong)(local_78 / local_a8));
        if (dVar17 <= local_b8) {
          local_b8 = dVar17;
        }
        bVar10 = lVar12 < ncols;
        if (ncols <= lVar12) break;
        lVar13 = lVar13 + (long)iVar1 * 0x10 + (long)iVar2 * -0x10;
        lVar15 = lVar15 + 0x10;
        lVar11 = lVar12;
      } while (lVar12 < *(int *)(*(long *)((long)pvVar5 + 0x30) + (local_90 + 1) * 4));
    }
    local_90 = local_90 + 1;
  } while (bVar10);
  superlu_free(addr);
  return local_b8;
}

Assistant:

double
zPivotGrowth(int ncols, SuperMatrix *A, int *perm_c, 
             SuperMatrix *L, SuperMatrix *U)
{

    NCformat *Astore;
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex  *Aval, *Lval, *Uval;
    int      fsupc, nsupr;
    int_t    luptr, nz_in_U;
    int_t    i, j, k, oldcol;
    int      *inv_perm_c;
    double   rpg, maxaj, maxuj;
    double   smlnum;
    doublecomplex   *luval;
   
    /* Get machine constants. */
    smlnum = dmach("S");
    rpg = 1. / smlnum;

    Astore = A->Store;
    Lstore = L->Store;
    Ustore = U->Store;
    Aval = Astore->nzval;
    Lval = Lstore->nzval;
    Uval = Ustore->nzval;
    
    inv_perm_c = (int *) SUPERLU_MALLOC(A->ncol*sizeof(int));
    for (j = 0; j < A->ncol; ++j) inv_perm_c[perm_c[j]] = j;

    for (k = 0; k <= Lstore->nsuper; ++k) {
	fsupc = L_FST_SUPC(k);
	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	luptr = L_NZ_START(fsupc);
	luval = &Lval[luptr];
	nz_in_U = 1;
	
	for (j = fsupc; j < L_FST_SUPC(k+1) && j < ncols; ++j) {
	    maxaj = 0.;
            oldcol = inv_perm_c[j];
	    for (i = Astore->colptr[oldcol]; i < Astore->colptr[oldcol+1]; ++i)
		maxaj = SUPERLU_MAX( maxaj, z_abs1( &Aval[i]) );
	
	    maxuj = 0.;
	    for (i = Ustore->colptr[j]; i < Ustore->colptr[j+1]; i++)
		maxuj = SUPERLU_MAX( maxuj, z_abs1( &Uval[i]) );
	    
	    /* Supernode */
	    for (i = 0; i < nz_in_U; ++i)
		maxuj = SUPERLU_MAX( maxuj, z_abs1( &luval[i]) );

	    ++nz_in_U;
	    luval += nsupr;

	    if ( maxuj == 0. )
		rpg = SUPERLU_MIN( rpg, 1.);
	    else
		rpg = SUPERLU_MIN( rpg, maxaj / maxuj );
	}
	
	if ( j >= ncols ) break;
    }

    SUPERLU_FREE(inv_perm_c);
    return (rpg);
}